

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,0u>
          (Float<unsigned_int,_5,_5,_15,_0U> *other)

{
  uint uVar1;
  long lVar2;
  StorageType SVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x3ff) == 0x3e0) {
    SVar3 = 0xff800000;
    if ((uVar1 >> 10 & 1) == 0) {
      SVar3 = 0x7f800000;
    }
    return (Float<unsigned_int,_8,_23,_127,_3U>)SVar3;
  }
  uVar6 = uVar1 & 0x1f;
  uVar4 = 0x7fffffff;
  if (((uVar1 & 0x3e0) != 0x3e0 || uVar6 == 0) && (uVar4 = uVar1 << 0x15, (uVar1 & 0x3ff) != 0)) {
    if ((uVar1 & 0x3e0) == 0 && uVar6 != 0) {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      iVar5 = ((uint)lVar2 ^ 0xffffffc0) + 0x2d;
      uVar6 = uVar6 << (~(byte)lVar2 + 6 & 0x1f);
    }
    else {
      iVar5 = (uVar1 >> 5 & 0x1f) - 0xf;
      uVar6 = uVar6 + 0x20;
    }
    uVar4 = (uVar6 & 0x1fdf) << 0x12 | uVar4 & 0x80000000 | iVar5 * 0x800000 + 0x3f800000U;
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)uVar4;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}